

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O2

CTransactionRef __thiscall
miniminer_tests::make_tx
          (miniminer_tests *this,vector<COutPoint,_std::allocator<COutPoint>_> *inputs,
          size_t num_outputs)

{
  undefined8 *puVar1;
  uchar *puVar2;
  pointer pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long lVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  CTransactionRef CVar11;
  CMutableTransaction tx;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&tx);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&tx.vin,((long)(inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>).
                           _M_impl.super__Vector_impl_data._M_start) / 0x24);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx.vout,num_outputs);
  lVar7 = 0;
  lVar8 = 0;
  for (uVar9 = 0;
      pCVar3 = (inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar9 < (ulong)(((long)(inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0x24);
      uVar9 = uVar9 + 1) {
    *(undefined4 *)
     ((long)(&((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->prevout).hash + 1) + lVar8) =
         *(undefined4 *)((long)(&pCVar3->hash + 1) + lVar7);
    puVar1 = (undefined8 *)((long)&(pCVar3->hash).m_wrapped.super_base_blob<256U> + lVar7);
    uVar4 = *puVar1;
    uVar5 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(pCVar3->hash).m_wrapped.super_base_blob<256U> + lVar7 + 0x10);
    uVar6 = puVar1[1];
    puVar2 = ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + lVar8 + 0x10;
    *(undefined8 *)puVar2 = *puVar1;
    *(undefined8 *)(puVar2 + 8) = uVar6;
    puVar2 = ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + lVar8;
    *(undefined8 *)puVar2 = uVar4;
    *(undefined8 *)(puVar2 + 8) = uVar5;
    lVar8 = lVar8 + 0x68;
    lVar7 = lVar7 + 0x24;
  }
  lVar7 = 8;
  while (bVar10 = num_outputs != 0, num_outputs = num_outputs - 1, bVar10) {
    local_58._16_8_ = 0;
    local_58._24_8_ = 0;
    local_58._0_8_ = (char *)0x0;
    local_58._8_8_ = 0;
    this_00 = CScript::operator<<((CScript *)local_58,OP_11);
    other = &CScript::operator<<(this_00,OP_EQUAL)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&(tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue + lVar7),other);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
    *(undefined8 *)
     ((long)tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start + lVar7 + -8) = 100000000;
    lVar7 = lVar7 + 0x28;
  }
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)this);
  CMutableTransaction::~CMutableTransaction(&tx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    CVar11.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    CVar11.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (CTransactionRef)
           CVar11.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

static inline CTransactionRef make_tx(const std::vector<COutPoint>& inputs, size_t num_outputs)
{
    CMutableTransaction tx = CMutableTransaction();
    tx.vin.resize(inputs.size());
    tx.vout.resize(num_outputs);
    for (size_t i = 0; i < inputs.size(); ++i) {
        tx.vin[i].prevout = inputs[i];
    }
    for (size_t i = 0; i < num_outputs; ++i) {
        tx.vout[i].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        // The actual input and output values of these transactions don't really
        // matter, since all accounting will use the entries' cached fees.
        tx.vout[i].nValue = COIN;
    }
    return MakeTransactionRef(tx);
}